

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bounds.cpp
# Opt level: O2

void __thiscall libDAI::BoundTree::display(BoundTree *this,ostream *os,FactorGraph *fg)

{
  ostream *poVar1;
  char *pcVar2;
  pre_order_iterator local_40;
  
  poVar1 = std::operator<<(os,"digraph G {");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(os,"node[shape=circle,width=0.4,fixedsize=true];");
  std::endl<char,std::char_traits<char>>(poVar1);
  local_40.super_iterator_base.node = *(tree_node **)(*(long *)&this->tr + 0x20);
  local_40.super_iterator_base.skip_current_children_ = false;
  while (*(tree_node **)&this->field_0x20 != local_40.super_iterator_base.node) {
    if (((local_40.super_iterator_base.node)->data)._type == VAR) {
      poVar1 = std::operator<<(os,"\t");
      poVar1 = libDAI::operator<<(poVar1,&(local_40.super_iterator_base.node)->data);
      poVar1 = std::operator<<(poVar1,"[label=v");
      (*(fg->super_GraphicalModel)._vptr_GraphicalModel[6])
                (fg,((local_40.super_iterator_base.node)->data)._index);
      std::ostream::_M_insert<long>((long)poVar1);
      pcVar2 = "];";
      if (((local_40.super_iterator_base.node)->data)._forcedleaf != false) {
        pcVar2 = ",color=gray,style=filled];";
      }
      poVar1 = std::operator<<(os,pcVar2);
      std::endl<char,std::char_traits<char>>(poVar1);
    }
    tree<libDAI::BoundTreeNode,_std::allocator<tree_node_<libDAI::BoundTreeNode>_>_>::
    pre_order_iterator::operator++(&local_40,0);
  }
  poVar1 = std::operator<<(os,"node[shape=box,width=0.3,height=0.3,fixedsize=true];");
  std::endl<char,std::char_traits<char>>(poVar1);
  local_40.super_iterator_base.node = *(tree_node **)(*(long *)&this->tr + 0x20);
  local_40.super_iterator_base.skip_current_children_ = false;
  while (*(tree_node **)&this->field_0x20 != local_40.super_iterator_base.node) {
    if (((local_40.super_iterator_base.node)->data)._type == FACTOR) {
      poVar1 = std::operator<<(os,"\t");
      poVar1 = libDAI::operator<<(poVar1,&(local_40.super_iterator_base.node)->data);
      poVar1 = std::operator<<(poVar1,"[label=f");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      pcVar2 = "];";
      if (((local_40.super_iterator_base.node)->data)._forcedleaf != false) {
        pcVar2 = ",color=gray,style=filled];";
      }
      poVar1 = std::operator<<(os,pcVar2);
      std::endl<char,std::char_traits<char>>(poVar1);
    }
    tree<libDAI::BoundTreeNode,_std::allocator<tree_node_<libDAI::BoundTreeNode>_>_>::
    pre_order_iterator::operator++(&local_40,0);
  }
  poVar1 = std::operator<<(os,"edge[color=black];");
  std::endl<char,std::char_traits<char>>(poVar1);
  local_40.super_iterator_base.node = *(tree_node **)(*(long *)&this->tr + 0x20);
  local_40.super_iterator_base.skip_current_children_ = false;
  while (*(tree_node **)&this->field_0x20 != local_40.super_iterator_base.node) {
    if (*(tree_node **)(*(long *)&this->tr + 0x20) != local_40.super_iterator_base.node) {
      poVar1 = std::operator<<(os,"\t");
      poVar1 = libDAI::operator<<(poVar1,&(local_40.super_iterator_base.node)->parent->data);
      poVar1 = std::operator<<(poVar1," -> ");
      poVar1 = libDAI::operator<<(poVar1,&(local_40.super_iterator_base.node)->data);
      std::endl<char,std::char_traits<char>>(poVar1);
    }
    tree<libDAI::BoundTreeNode,_std::allocator<tree_node_<libDAI::BoundTreeNode>_>_>::
    pre_order_iterator::operator++(&local_40,0);
  }
  poVar1 = std::operator<<(os,"}");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void BoundTree::display( std::ostream & os, const FactorGraph &fg ) {
//        if( true ) {
        os << "digraph G {" << endl;

        // variables
        os << "node[shape=circle,width=0.4,fixedsize=true];" << endl;
        for( tree<BoundTreeNode>::iterator node = tr.begin(); node != tr.end(); node++ )
            if( node->_type == BoundTreeNode::VAR ) {
                os << "\t" << (*node) << "[label=v" << fg.var(node->_index).label();
                if( node->_forcedleaf )
                    os << ",color=gray,style=filled];" << endl;
                else
                    os << "];" << endl;
            }

        //factors 
        os << "node[shape=box,width=0.3,height=0.3,fixedsize=true];" << endl;
        for( tree<BoundTreeNode>::iterator node = tr.begin(); node != tr.end(); node++ )
            if( node->_type == BoundTreeNode::FACTOR ) {
                os << "\t" << (*node) << "[label=f" << node->_index;
                if( node->_forcedleaf )
                    os << ",color=gray,style=filled];" << endl;
                else
                    os << "];" << endl;
            }

        // edges
        os << "edge[color=black];" << endl;
        for( tree<BoundTreeNode>::iterator node = tr.begin(); node != tr.end(); node++ )
            if( node != tr.begin() )
                os << "\t" << (*tr.parent(node)) << " -> " << (*node) << endl;

        os << "}" << endl;
/*        } else {
            os << "graph G {" << endl;

            // variables
            os << "node[shape=circle,width=0.4,fixedsize=true,color=lightgray];" << endl;
            for( size_t j = 0; j < fg.nrVars(); j++ ) {
                os << "\tv" << fg.var(j).label();
                tree<BoundTreeNode>::iterator node = find( BoundTreeNode::VAR, j );
                if( node == tr.begin() )
                    os << "[color=blue,style=filled];" << endl;
                else if( node != tr.end() ) {
                    if( node->_forcedleaf )
                        os << "[color=blue,style=filled];" << endl;
                    else
                        os << "[color=blue];" << endl;
                } else
                    os << ";" << endl;
            }

            //factors 
            os << "node[shape=box,width=0.3,height=0.3,fixedsize=true,color=lightgray];" << endl;
            for( size_t I = 0; I < fg.nrFactors(); I++ ) {
                os << "\tf" << I;
                tree<BoundTreeNode>::iterator node = find( BoundTreeNode::FACTOR, I );
                if( node != tr.end() ) {
                    if( node->_forcedleaf )
                        os << "[color=blue,style=filled];" << endl;
                    else
                        os << "[color=blue];" << endl;
                } else
                    os << ";" << endl;
            }

            // edges
            os << "edge[color=lightgray];" << endl;
            for( size_t e = 0; e < fg.nrEdges(); e++ ) {
                size_t i = fg.edge(e).first;
                size_t I = fg.edge(e).second;
                if( containsEdge( i, I ) )
                    os << "\tv" << fg.var(i).label() << " -- f" << I << "[color=blue];" << endl;
                else
                    os << "\tv" << fg.var(i).label() << " -- f" << I << ";" << endl;
            }
            os << "}" << endl;
        }*/
    }